

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void idtx8x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (0 < col_num) {
    lVar6 = 0;
    do {
      piVar1 = (int *)((long)*in + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)*out + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      piVar1 = (int *)((long)in[1] + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)out[1] + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      piVar1 = (int *)((long)in[2] + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)out[2] + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      piVar1 = (int *)((long)in[3] + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)out[3] + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      piVar1 = (int *)((long)in[4] + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)out[4] + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      piVar1 = (int *)((long)in[5] + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)out[5] + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      piVar1 = (int *)((long)in[6] + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)out[6] + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      piVar1 = (int *)((long)in[7] + lVar6);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)out[7] + lVar6);
      *piVar2 = *piVar1 * 2;
      piVar2[1] = iVar3 * 2;
      piVar2[2] = iVar4 * 2;
      piVar2[3] = iVar5 * 2;
      lVar6 = lVar6 + 0x80;
    } while ((ulong)(uint)col_num << 7 != lVar6);
  }
  return;
}

Assistant:

static void idtx8x8_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;

  for (int i = 0; i < col_num; i += 1) {
    out[0 + 8 * i] = _mm_add_epi32(in[0 + 8 * i], in[0 + 8 * i]);
    out[1 + 8 * i] = _mm_add_epi32(in[1 + 8 * i], in[1 + 8 * i]);
    out[2 + 8 * i] = _mm_add_epi32(in[2 + 8 * i], in[2 + 8 * i]);
    out[3 + 8 * i] = _mm_add_epi32(in[3 + 8 * i], in[3 + 8 * i]);
    out[4 + 8 * i] = _mm_add_epi32(in[4 + 8 * i], in[4 + 8 * i]);
    out[5 + 8 * i] = _mm_add_epi32(in[5 + 8 * i], in[5 + 8 * i]);
    out[6 + 8 * i] = _mm_add_epi32(in[6 + 8 * i], in[6 + 8 * i]);
    out[7 + 8 * i] = _mm_add_epi32(in[7 + 8 * i], in[7 + 8 * i]);
  }
}